

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

void __thiscall
Game::Game(Game *this,unique_ptr<Player,_std::default_delete<Player>_> *white_player,
          unique_ptr<Player,_std::default_delete<Player>_> *black_player,bool walk_through,
          string *pre_turns)

{
  this->m_walk_through = walk_through;
  (this->m_pre_turns).
  super__Vector_base<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pre_turns).
  super__Vector_base<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pre_turns).
  super__Vector_base<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Board::Board(&this->m_board);
  this->m_turn = 0;
  (this->m_turns).
  super__Vector_base<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_turns).
  super__Vector_base<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_turns).
  super__Vector_base<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_white_player)._M_t.super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
  super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
  super__Head_base<0UL,_Player_*,_false>._M_head_impl =
       (white_player->_M_t).super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
       super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
       super__Head_base<0UL,_Player_*,_false>._M_head_impl;
  (white_player->_M_t).super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
  super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
  super__Head_base<0UL,_Player_*,_false>._M_head_impl = (Player *)0x0;
  (this->m_black_player)._M_t.super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
  super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
  super__Head_base<0UL,_Player_*,_false>._M_head_impl =
       (black_player->_M_t).super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
       super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
       super__Head_base<0UL,_Player_*,_false>._M_head_impl;
  (black_player->_M_t).super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
  super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
  super__Head_base<0UL,_Player_*,_false>._M_head_impl = (Player *)0x0;
  setup_turns(this,pre_turns);
  return;
}

Assistant:

Game::Game(unique_ptr<Player> white_player, unique_ptr<Player> black_player, bool walk_through, const string &pre_turns)
        : m_white_player(move(white_player)), m_black_player(move(black_player)), m_walk_through(walk_through),
          m_board(), m_turn(0) {
    setup_turns(pre_turns);
}